

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O2

void __thiscall ClassBundle::updateFieldType(ClassBundle *this,FieldType *type)

{
  pointer pFVar1;
  pointer pCVar2;
  pointer pbVar3;
  __type _Var4;
  mapped_type *pmVar5;
  ostream *poVar6;
  FieldType *itr;
  pointer type_00;
  pointer pbVar7;
  pointer pCVar8;
  string cleanType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> builtinClass;
  string remainingType;
  Field onlyBaseType;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Field local_70;
  
  pFVar1 = (type->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (type_00 = (type->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>.
                 _M_impl.super__Vector_impl_data._M_start; type_00 != pFVar1; type_00 = type_00 + 1)
  {
    updateFieldType(this,type_00);
  }
  Field::Field(&local_70);
  std::__cxx11::string::_M_assign((string *)&local_70);
  Field::onlyType_abi_cxx11_(&local_f0,&local_70);
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_70);
  pbVar3 = builtinClasses_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = builtinClasses_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar7 == pbVar3) {
      pCVar8 = (this->allClasses).super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar2 = (this->allClasses).super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
               super__Vector_impl_data._M_finish;
      goto LAB_0010a155;
    }
    std::__cxx11::string::string((string *)&local_d0,(string *)pbVar7);
    _Var4 = std::operator==(&local_f0,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    pbVar7 = pbVar7 + 1;
  } while (!_Var4);
LAB_0010a256:
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  Field::~Field(&local_70);
  return;
LAB_0010a155:
  if (pCVar8 == pCVar2) goto LAB_0010a1b2;
  std::operator+(&local_d0,&pCVar8->scope,&pCVar8->name);
  if (local_f0._M_string_length <= local_d0._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_d0);
    _Var4 = std::operator==(&local_f0,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (_Var4) {
      std::operator+(&local_90,&local_d0,&local_b0);
      std::__cxx11::string::operator=((string *)type,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_d0);
      goto LAB_0010a256;
    }
  }
  std::__cxx11::string::~string((string *)&local_d0);
  pCVar8 = pCVar8 + 1;
  goto LAB_0010a155;
LAB_0010a1b2:
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->unknownClasses,&local_f0);
  if (*pmVar5 != 1) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->unknownClasses,&local_f0);
    *pmVar5 = 1;
    poVar6 = std::operator<<((ostream *)&std::cerr,"[Warning]\t");
    poVar6 = std::operator<<(poVar6,"Cannot determine full scope for class \"");
    poVar6 = std::operator<<(poVar6,(string *)&local_f0);
    std::operator<<(poVar6,"\"\n");
  }
  goto LAB_0010a256;
}

Assistant:

void updateFieldType(FieldType &type) {
        // solve childrens
        for (auto& itr : type.templateTypes) {
            updateFieldType(itr);
        }

        Field onlyBaseType;
        onlyBaseType.type = type.name;

        std::string cleanType = onlyBaseType.onlyType();
        std::string remainingType = onlyBaseType.type.substr(cleanType.size(), onlyBaseType.type.size());

        for (auto builtinClass : this->builtinClasses) {
            if (cleanType == builtinClass) {
                return;
            }
        }

        for (auto& targetClass : this->allClasses) {
            // check if classType ends with my type
            std::string classType = targetClass.scope + targetClass.name;

            if (classType.size() < cleanType.size()) {
                continue;
            }

            if (cleanType == classType.substr(classType.size() - cleanType.size(), cleanType.size())) {
                type.name = classType + remainingType;
                return;
            }
        }

        if (unknownClasses[cleanType] == 1) {
            return;
        }

        unknownClasses[cleanType] = 1;
        std::cerr << "[Warning]\t" << "Cannot determine full scope for class \"" << cleanType << "\"\n";

    }